

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

Vec_Int_t *
Saig_ManExtendCounterExampleTest3(Aig_Man_t *pAig,int iFirstFlopPi,Abc_Cex_t *pCex,int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  abctime aVar6;
  Saig_RefMan_t *p_00;
  Vec_Int_t *vReasons_00;
  abctime aVar7;
  abctime clk;
  Vec_Int_t *vReasons;
  Vec_Int_t *vRes;
  Saig_RefMan_t *p;
  int fVerbose_local;
  Abc_Cex_t *pCex_local;
  int iFirstFlopPi_local;
  Aig_Man_t *pAig_local;
  
  iVar1 = Saig_ManPiNum(pAig);
  if (iVar1 == pCex->nPis) {
    aVar6 = Abc_Clock();
    p_00 = Saig_RefManStart(pAig,pCex,iFirstFlopPi,fVerbose);
    vReasons_00 = Saig_RefManFindReason(p_00);
    pAig_local = (Aig_Man_t *)Saig_RefManReason2Inputs(p_00,vReasons_00);
    uVar2 = Aig_ManCiNum(p_00->pFrames);
    uVar3 = Vec_IntSize(vReasons_00);
    iVar4 = Saig_ManPiNum(p_00->pAig);
    iVar1 = p_00->nInputs;
    uVar5 = Vec_IntSize((Vec_Int_t *)pAig_local);
    printf("Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",(ulong)uVar2,
           (ulong)uVar3,(ulong)(uint)(iVar4 - iVar1),(ulong)uVar5);
    Abc_Print(1,"%s =","Time");
    aVar7 = Abc_Clock();
    Abc_Print(1,"%9.2f sec\n",((double)(aVar7 - aVar6) * 1.0) / 1000000.0);
    Vec_IntFree(vReasons_00);
    Saig_RefManStop(p_00);
  }
  else {
    uVar2 = Aig_ManCiNum(pAig);
    printf("Saig_ManExtendCounterExampleTest3(): The PI count of AIG (%d) does not match that of cex (%d).\n"
           ,(ulong)uVar2,(ulong)(uint)pCex->nPis);
    pAig_local = (Aig_Man_t *)0x0;
  }
  return (Vec_Int_t *)pAig_local;
}

Assistant:

Vec_Int_t * Saig_ManExtendCounterExampleTest3( Aig_Man_t * pAig, int iFirstFlopPi, Abc_Cex_t * pCex, int fVerbose )
{
    Saig_RefMan_t * p;
    Vec_Int_t * vRes, * vReasons;
    abctime clk;
    if ( Saig_ManPiNum(pAig) != pCex->nPis )
    {
        printf( "Saig_ManExtendCounterExampleTest3(): The PI count of AIG (%d) does not match that of cex (%d).\n", 
            Aig_ManCiNum(pAig), pCex->nPis );
        return NULL;
    }

clk = Abc_Clock();

    p = Saig_RefManStart( pAig, pCex, iFirstFlopPi, fVerbose );
    vReasons = Saig_RefManFindReason( p );
    vRes = Saig_RefManReason2Inputs( p, vReasons );

//    if ( fVerbose )
    {
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }

/*
    ////////////////////////////////////
    Vec_IntFree( vReasons );
    vReasons = Saig_RefManRefineWithSat( p, vRes );
    ////////////////////////////////////

    // derive new result
    Vec_IntFree( vRes );
    vRes = Saig_RefManReason2Inputs( p, vReasons );
//    if ( fVerbose )
    {
        printf( "Frame PIs = %4d (essential = %4d)   AIG PIs = %4d (essential = %4d)   ",
            Aig_ManCiNum(p->pFrames), Vec_IntSize(vReasons), 
            Saig_ManPiNum(p->pAig) - p->nInputs, Vec_IntSize(vRes) );
ABC_PRT( "Time", Abc_Clock() - clk );
    }
*/

    Vec_IntFree( vReasons );
    Saig_RefManStop( p );
    return vRes;
}